

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qo_manager.cc
# Opt level: O3

void __thiscall QO_Manager::~QO_Manager(QO_Manager *this)

{
  _Base_ptr p_Var1;
  _Base_ptr p_Var2;
  pointer pmVar3;
  int iVar4;
  long lVar5;
  
  iVar4 = this->nRels;
  if (0 < iVar4) {
    pmVar3 = (this->optcost).
             super__Vector_base<std::map<int,_costElem_*,_std::less<int>,_std::allocator<std::pair<const_int,_costElem_*>_>_>,_std::allocator<std::map<int,_costElem_*,_std::less<int>,_std::allocator<std::pair<const_int,_costElem_*>_>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    lVar5 = 0;
    do {
      p_Var2 = *(_Base_ptr *)((long)&pmVar3[lVar5]._M_t._M_impl.super__Rb_tree_header + 0x10);
      if (p_Var2 != &pmVar3[lVar5]._M_t._M_impl.super__Rb_tree_header._M_header) {
        do {
          p_Var1 = p_Var2[1]._M_parent;
          if (p_Var1 != (_Base_ptr)0x0) {
            std::
            _Rb_tree<int,_std::pair<const_int,_attrStat>,_std::_Select1st<std::pair<const_int,_attrStat>_>,_std::less<int>,_std::allocator<std::pair<const_int,_attrStat>_>_>
            ::~_Rb_tree((_Rb_tree<int,_std::pair<const_int,_attrStat>,_std::_Select1st<std::pair<const_int,_attrStat>_>,_std::less<int>,_std::allocator<std::pair<const_int,_attrStat>_>_>
                         *)&p_Var1->_M_right);
          }
          operator_delete(p_Var1);
          p_Var2 = (_Base_ptr)std::_Rb_tree_increment(p_Var2);
          pmVar3 = (this->optcost).
                   super__Vector_base<std::map<int,_costElem_*,_std::less<int>,_std::allocator<std::pair<const_int,_costElem_*>_>_>,_std::allocator<std::map<int,_costElem_*,_std::less<int>,_std::allocator<std::pair<const_int,_costElem_*>_>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
        } while (p_Var2 != &pmVar3[lVar5]._M_t._M_impl.super__Rb_tree_header._M_header);
        iVar4 = this->nRels;
      }
      lVar5 = lVar5 + 1;
    } while (lVar5 < iVar4);
  }
  std::
  vector<std::map<int,_costElem_*,_std::less<int>,_std::allocator<std::pair<const_int,_costElem_*>_>_>,_std::allocator<std::map<int,_costElem_*,_std::less<int>,_std::allocator<std::pair<const_int,_costElem_*>_>_>_>_>
  ::~vector(&this->optcost);
  return;
}

Assistant:

QO_Manager::~QO_Manager(){
  for(int i=0; i < nRels; i++){
    map<int, costElem*>::iterator it;
    for(it= optcost[i].begin(); it != optcost[i].end(); ++it){
      delete it->second;
    }
  }
}